

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O2

RK_S32 mpp_av1_read_increment
                 (BitReadCtx_t *gbc,RK_U32 range_min,RK_U32 range_max,char *name,RK_U32 *write_to)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  RK_S32 _out;
  char *local_40;
  uint *local_38;
  
  local_40 = name;
  local_38 = write_to;
  if ((range_max < range_min || 0x1f < range_max - range_min) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "range_min <= range_max && range_max - range_min < sizeof(bits) - 1",
                 "mpp_av1_read_increment",0x90), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  for (; range_min < range_max; range_min = range_min + 1) {
    RVar1 = mpp_get_bits_left(gbc);
    if (RVar1 < 1) {
      _mpp_log_l(2,"av1d_cbs","Invalid increment value at %s: bitstream ended.\n",
                 "mpp_av1_read_increment",local_40);
      return -1;
    }
    MVar2 = mpp_read_bits(gbc,1,&_out);
    gbc->ret = MVar2;
    if (MVar2 != MPP_OK) {
      return -1;
    }
    if ((char)_out == '\0') break;
  }
  *local_38 = range_min;
  return 0;
}

Assistant:

static RK_S32 mpp_av1_read_increment(BitReadCtx_t *gbc, RK_U32 range_min,
                                     RK_U32 range_max, const char *name,
                                     RK_U32 *write_to)
{
    RK_U32 value;
    RK_S32 i;
    RK_S8 bits[33];

    mpp_assert(range_min <= range_max && range_max - range_min < sizeof(bits) - 1);

    for (i = 0, value = range_min; value < range_max;) {
        RK_U8 tmp = 0;
        if (mpp_get_bits_left(gbc) < 1) {
            mpp_err_f("Invalid increment value at "
                      "%s: bitstream ended.\n", name);
            return MPP_NOK;
        }
        READ_ONEBIT(gbc, &tmp);
        if (tmp) {
            bits[i++] = '1';
            ++value;
        } else {
            bits[i++] = '0';
            break;
        }
    }
    *write_to = value;
    return MPP_OK;

__bitread_error:
    return MPP_NOK;
}